

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O0

int qEnvironmentVariableIntValue(char *varName,bool *ok)

{
  long lVar1;
  bool bVar2;
  longlong *plVar3;
  longlong lVar4;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  optional<long_long> oVar5;
  optional<long_long> value;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  optional<long_long> *in_stack_ffffffffffffffb8;
  _Storage<long_long,_true> local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._M_value = (longlong)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  oVar5 = qEnvironmentVariableIntegerValue(in_RDI);
  local_18._M_value =
       oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  local_10 = (undefined1 *)
             CONCAT71(local_10._1_7_,
                      oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
                      super__Optional_payload_base<long_long>._M_engaged);
  bVar2 = std::optional::operator_cast_to_bool((optional<long_long> *)0x25e455);
  if (bVar2) {
    plVar3 = std::optional<long_long>::operator*((optional<long_long> *)0x25e465);
    lVar1 = *plVar3;
    plVar3 = std::optional<long_long>::operator*((optional<long_long> *)0x25e477);
    if (lVar1 != (int)*plVar3) {
      std::optional<long_long>::operator=((optional<long_long> *)&local_18);
    }
  }
  if (in_RSI != 0) {
    bVar2 = std::optional::operator_cast_to_bool((optional<long_long> *)0x25e4a6);
    *(bool *)in_RSI = bVar2;
  }
  lVar4 = std::optional<long_long>::value_or<int>
                    (in_stack_ffffffffffffffb8,
                     (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)lVar4;
}

Assistant:

int qEnvironmentVariableIntValue(const char *varName, bool *ok) noexcept
{
    std::optional<qint64> value = qEnvironmentVariableIntegerValue(varName);
    if (value && *value != int(*value))
        value = std::nullopt;
    if (ok)
        *ok = bool(value);
    return value.value_or(0);
}